

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiDockContextPruneNodeData * __thiscall
ImPool<ImGuiDockContextPruneNodeData>::Add(ImPool<ImGuiDockContextPruneNodeData> *this)

{
  int i;
  ImGuiDockContextPruneNodeData *pIVar1;
  int idx;
  ImPool<ImGuiDockContextPruneNodeData> *this_local;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiDockContextPruneNodeData>::resize(&this->Buf,(this->Buf).Size + 1);
    this->FreeIdx = this->FreeIdx + 1;
  }
  else {
    pIVar1 = ImVector<ImGuiDockContextPruneNodeData>::operator[](&this->Buf,i);
    this->FreeIdx = pIVar1->CountWindows;
  }
  ImVector<ImGuiDockContextPruneNodeData>::operator[](&this->Buf,i);
  pIVar1 = (ImGuiDockContextPruneNodeData *)operator_new(0x10);
  ImGuiDockContextPruneNodeData::ImGuiDockContextPruneNodeData(pIVar1);
  pIVar1 = ImVector<ImGuiDockContextPruneNodeData>::operator[](&this->Buf,i);
  return pIVar1;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }